

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O2

void __thiscall MC::MC_Driver::emit(MC_Driver *this,string *message)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"rpn ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void 
MC::MC_Driver::emit(const std::string &message){
    std::cout << "rpn "<< message << std::endl;
}